

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proitems.cpp
# Opt level: O2

bool __thiscall ProStringList::contains(ProStringList *this,char *str,CaseSensitivity cs)

{
  ulong uVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  
  uVar4 = 0xffffffffffffffff;
  lVar3 = 0;
  do {
    uVar1 = (this->super_QList<ProString>).d.size;
    uVar4 = uVar4 + 1;
    if (uVar1 <= uVar4) break;
    iVar2 = ProString::compare((ProString *)
                               ((long)&(((this->super_QList<ProString>).d.ptr)->m_string).d.d +
                               lVar3),str,cs);
    lVar3 = lVar3 + 0x30;
  } while (iVar2 != 0);
  return uVar4 < uVar1;
}

Assistant:

bool ProStringList::contains(const char *str, Qt::CaseSensitivity cs) const
{
    for (int i = 0; i < size(); i++)
        if (!at(i).compare(str, cs))
            return true;
    return false;
}